

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMathematics.cpp
# Opt level: O2

double chrono::ChRandom(void)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = ((long)(CH_PAseed ^ 0x75bd924) / 0x1f31d) * -0xb14;
  lVar2 = ((long)(CH_PAseed ^ 0x75bd924) % 0x1f31d) * 0x41a7;
  uVar3 = lVar2 + lVar1;
  uVar4 = lVar2 + 0x7fffffff + lVar1;
  if (-1 < (long)uVar3) {
    uVar4 = uVar3;
  }
  CH_PAseed = uVar4 ^ 0x75bd924;
  return (double)(long)uVar4 * 4.656612875245797e-10;
}

Assistant:

double ChRandom() {
    long k;
    double ans;
    CH_PAseed ^= MASK;
    k = (CH_PAseed) / IQ;
    CH_PAseed = IA * (CH_PAseed - k * IQ) - IR * k;
    if (CH_PAseed < 0)
        CH_PAseed += IM;
    ans = AM * (CH_PAseed);
    CH_PAseed ^= MASK;
    return ans;
}